

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# effect-handler-general.c
# Opt level: O3

_Bool effect_handler_SUMMON(effect_handler_context_t_conflict *context)

{
  int iVar1;
  loc grid;
  loc grid_00;
  loc grid_01;
  bool bVar2;
  wchar_t wVar3;
  wchar_t type;
  wchar_t wVar4;
  wchar_t wVar5;
  wchar_t wVar6;
  int iVar7;
  uint32_t uVar8;
  wchar_t wVar9;
  monster *pmVar10;
  player *ppVar11;
  short sVar12;
  char *pcVar13;
  wchar_t wVar14;
  int iVar15;
  
  wVar3 = effect_calculate_value(context,false);
  wVar14 = context->subtype;
  iVar1 = context->other;
  type = summon_message_type(wVar14);
  wVar4 = summon_fallback_type(wVar14);
  sound(type);
  if (player->upkeep->arena_level != false) {
    return true;
  }
  if ((context->origin).what == SRC_MONSTER) {
    pmVar10 = cave_monster(cave,(context->origin).which.monster);
    if (pmVar10 == (monster *)0x0) {
      __assert_fail("mon",
                    "/workspace/llm4binary/github/license_c_cmakelists/angband[P]angband/src/effect-handler-general.c"
                    ,0x8d3,"_Bool effect_handler_SUMMON(effect_handler_context_t *)");
    }
    wVar5 = summon_name_to_idx("KIN");
    if (wVar14 == wVar5) {
      kin_base = pmVar10->race->base;
    }
    wVar5 = pmVar10->race->level;
    sVar12 = player->depth;
    if (wVar3 < L'\x01' || wVar5 * sVar12 < 1) {
      iVar7 = 0;
      iVar15 = 0;
    }
    else {
      iVar15 = 0;
      iVar7 = 0;
      wVar9 = L'\x01';
      do {
        grid.x = (pmVar10->grid).x;
        grid.y = (pmVar10->grid).y;
        wVar6 = summon_specific(grid,wVar5 + iVar1,wVar14,false,false);
        iVar7 = wVar6 * wVar6 + iVar7;
        iVar15 = (iVar15 + 1) - (uint)(iVar7 == 0);
        sVar12 = player->depth;
        if (sVar12 * wVar5 <= iVar7) break;
        bVar2 = wVar9 < wVar3;
        wVar9 = wVar9 + L'\x01';
      } while (bVar2);
    }
    if (wVar4 < L'\0' || iVar15 != 0) {
LAB_0013f431:
      ppVar11 = player;
      if (iVar15 != 0) {
        context->ident = true;
        goto LAB_0013f442;
      }
    }
    else if (iVar7 < sVar12 * wVar5 && L'\0' < wVar3) {
      iVar15 = 0;
      wVar14 = L'\x01';
      do {
        grid_01.x = (pmVar10->grid).x;
        grid_01.y = (pmVar10->grid).y;
        wVar9 = summon_specific(grid_01,iVar1 + wVar5,wVar4,false,false);
        iVar7 = wVar9 * wVar9 + iVar7;
        iVar15 = (iVar15 + 1) - (uint)(iVar7 == 0);
        if (player->depth * wVar5 <= iVar7) break;
        bVar2 = wVar14 < wVar3;
        wVar14 = wVar14 + L'\x01';
      } while (bVar2);
      goto LAB_0013f431;
    }
    msg("But nothing comes.");
    context->ident = true;
  }
  else {
    if (wVar3 == L'\0') {
      context->ident = true;
      return true;
    }
    iVar15 = 0;
    do {
      ppVar11 = player;
      sVar12 = player->depth;
      uVar8 = Rand_div(4);
      grid_00.x = (ppVar11->grid).x;
      grid_00.y = (ppVar11->grid).y;
      wVar4 = summon_specific(grid_00,sVar12 + iVar1,wVar14,true,uVar8 == 0);
      iVar15 = iVar15 + wVar4;
      wVar3 = wVar3 + L'\xffffffff';
    } while (wVar3 != L'\0');
    context->ident = true;
    ppVar11 = player;
    if (iVar15 == 0) {
      return true;
    }
LAB_0013f442:
    if (ppVar11->timed[2] != 0) {
      pcVar13 = "something";
      if (1 < iVar15) {
        pcVar13 = "many things";
      }
      msgt(type,"You hear %s appear nearby.",pcVar13);
    }
  }
  return true;
}

Assistant:

bool effect_handler_SUMMON(effect_handler_context_t *context)
{
	int summon_max = effect_calculate_value(context, false);
	int summon_type = context->subtype;
	int level_boost = context->other;
	int message_type = summon_message_type(summon_type);
	int fallback_type = summon_fallback_type(summon_type);
	int count = 0, val = 0, attempts = 0;

	sound(message_type);

	/* No summoning in arena levels */
	if (player->upkeep->arena_level) return true;

	/* Monster summon */
	if (context->origin.what == SRC_MONSTER) {
		struct monster *mon = cave_monster(cave, context->origin.which.monster);
		int rlev;

		assert(mon);

		/* Set the kin_base if necessary */
		if (summon_type == summon_name_to_idx("KIN")) {
			kin_base = mon->race->base;
		}

		/* Continue summoning until we reach the current dungeon level */
		rlev = mon->race->level;
		while ((val < player->depth * rlev) && (attempts < summon_max)) {
			int temp;

			/* Get a monster */
			temp = summon_specific(mon->grid, rlev + level_boost, summon_type,
								   false, false);

			val += temp * temp;

			/* Increase the attempt in case no monsters were available. */
			attempts++;

			/* Increase count of summoned monsters */
			if (val > 0)
				count++;
		}

		/* If the summon failed and there's a fallback type, use that */
		if ((count == 0) && (fallback_type >= 0)) {
			attempts = 0;
			while ((val < player->depth * rlev) && (attempts < summon_max)) {
				int temp;

				/* Get a monster */
				temp = summon_specific(mon->grid, rlev + level_boost,
									   fallback_type, false, false);

				val += temp * temp;

				/* Increase the attempt in case no monsters were available. */
				attempts++;

				/* Increase count of summoned monsters */
				if (val > 0)
					count++;
			}
		}

		/* Summoner failed */
		if (!count)
			msg("But nothing comes.");
	} else {
		/* If not a monster summon, it's simple */
		while (summon_max) {
			count += summon_specific(player->grid, player->depth + level_boost,
									 summon_type, true, one_in_(4));
			summon_max--;
		}
	}

	/* Identify */
	context->ident = true;

	/* Message for the blind */
	if (count && player->timed[TMD_BLIND])
		msgt(message_type, "You hear %s appear nearby.",
			 (count > 1 ? "many things" : "something"));

	return true;
}